

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_tests.cpp
# Opt level: O3

void settings_tests::CheckValues(Settings *settings,string *single_val,string *list_val)

{
  size_type *psVar1;
  pointer pcVar2;
  UniValue val;
  pointer pUVar3;
  int iVar4;
  iterator pvVar5;
  iterator pvVar6;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  undefined8 in_stack_fffffffffffffd88;
  undefined8 in_stack_fffffffffffffda0;
  undefined8 in_stack_fffffffffffffda8;
  undefined8 in_stack_fffffffffffffdb0;
  undefined8 in_stack_fffffffffffffdb8;
  undefined8 in_stack_fffffffffffffdc0;
  pointer in_stack_fffffffffffffdc8;
  pointer pUVar7;
  bool in_stack_fffffffffffffdd0;
  undefined7 in_stack_fffffffffffffdd1;
  pointer in_stack_fffffffffffffdd8;
  undefined1 *local_218;
  undefined1 *local_210;
  char *local_208;
  char *local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  assertion_result local_1d8;
  size_type *local_1c0 [2];
  size_type local_1b0 [3];
  pointer local_198 [2];
  undefined1 local_188 [40];
  vector<UniValue,_std::allocator<UniValue>_> local_160;
  undefined1 *local_148;
  undefined8 local_140;
  undefined1 local_138 [9];
  undefined4 local_12f;
  undefined2 local_12b;
  char local_129;
  SettingsValue list_value;
  SettingsValue single_value;
  undefined1 local_78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  psVar1 = &list_value.val._M_string_length;
  list_value._0_8_ = psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&list_value,"section","");
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"name","");
  pvVar5 = (iterator)0x0;
  common::GetSetting(&single_value,settings,(string *)&list_value,(string *)local_58,false,false,
                     false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity + 1);
  }
  if ((size_type *)list_value._0_8_ != psVar1) {
    operator_delete((void *)list_value._0_8_,list_value.val._M_string_length + 1);
  }
  local_148 = local_138;
  list_value.val._M_dataplus._M_p = (pointer)&list_value.val.field_2;
  list_value.typ = VARR;
  list_value.val.field_2._M_local_buf[0] = '\0';
  list_value.val.field_2._M_allocated_capacity._1_7_ = (undefined7)local_138._1_8_;
  list_value.val.field_2._M_local_buf[8] = SUB81(local_138._1_8_,7);
  list_value.val.field_2._9_4_ = local_12f;
  list_value.val.field_2._13_2_ = local_12b;
  list_value.val.field_2._M_local_buf[0xf] = local_129;
  list_value.val._M_string_length = 0;
  local_140 = 0;
  local_138[0] = 0;
  list_value.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  list_value.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  list_value.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  list_value.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  list_value.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  list_value.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"section","");
  local_78._0_8_ = &local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"name","");
  pvVar6 = (iterator)0x0;
  common::GetSettingsList
            ((vector<UniValue,_std::allocator<UniValue>_> *)&stack0xfffffffffffffdc8,settings,
             (string *)local_58,(string *)local_78,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._0_8_ != &local_68) {
    operator_delete((void *)local_78._0_8_,local_68._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity + 1);
  }
  pUVar3 = (pointer)CONCAT71(in_stack_fffffffffffffdd1,in_stack_fffffffffffffdd0);
  if (in_stack_fffffffffffffdc8 != pUVar3) {
    pUVar7 = in_stack_fffffffffffffdc8;
    do {
      local_1b0[2]._0_4_ = in_stack_fffffffffffffdc8->typ;
      pcVar2 = (in_stack_fffffffffffffdc8->val)._M_dataplus._M_p;
      local_198[0] = (pointer)local_188;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_198,pcVar2,
                 pcVar2 + (in_stack_fffffffffffffdc8->val)._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_188 + 0x10),&in_stack_fffffffffffffdc8->keys);
      std::vector<UniValue,_std::allocator<UniValue>_>::vector
                (&local_160,&in_stack_fffffffffffffdc8->values);
      val.val._M_dataplus._M_p = (pointer)list_val;
      val._0_8_ = in_stack_fffffffffffffd88;
      val.val._M_string_length = (size_type)single_val;
      val.val.field_2._M_allocated_capacity = in_stack_fffffffffffffda0;
      val.val.field_2._8_8_ = in_stack_fffffffffffffda8;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffdb0;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffdb8;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffdc0;
      val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = pUVar7;
      val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish._0_1_ = in_stack_fffffffffffffdd0;
      val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish._1_7_ = in_stack_fffffffffffffdd1;
      val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffdd8;
      ::UniValue::push_back(&list_value,val);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_160);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_188 + 0x10));
      if (local_198[0] != (pointer)local_188) {
        operator_delete(local_198[0],(ulong)((long)&((_Alloc_hider *)local_188._0_8_)->_M_p + 1));
      }
      in_stack_fffffffffffffdc8 = in_stack_fffffffffffffdc8 + 1;
    } while (in_stack_fffffffffffffdc8 != pUVar3);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)&stack0xfffffffffffffdc8);
  local_208 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_200 = "";
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x76;
  file.m_begin = (iterator)&local_208;
  msg.m_end = pvVar5;
  msg.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_218,msg);
  ::UniValue::write_abi_cxx11_((UniValue *)local_1c0,(int)&single_value,(void *)0x0,0);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (single_val,(char *)local_1c0[0]);
  local_1d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar4 == 0);
  local_1d8.m_message.px = (element_type *)0x0;
  local_1d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_1e0 = "";
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013894d8;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01388fc8;
  local_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_1f8 = single_val;
  local_1f0 = &stack0xfffffffffffffdc0;
  local_68._8_8_ = &local_1f8;
  local_48._8_8_ = &local_1f0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1d8,(lazy_ostream *)&stack0xfffffffffffffdc8,1,2,REQUIRE,0xee8638,
             (size_t)&local_1e8,0x76,local_58,"single_val",local_78);
  boost::detail::shared_count::~shared_count(&local_1d8.m_message.pn);
  if (local_1c0[0] != local_1b0) {
    operator_delete(local_1c0[0],local_1b0[0] + 1);
  }
  file_00.m_end = (iterator)0x77;
  file_00.m_begin = &stack0xfffffffffffffdb0;
  msg_00.m_end = pvVar6;
  msg_00.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,
             (size_t)&stack0xfffffffffffffda0,msg_00);
  ::UniValue::write_abi_cxx11_((UniValue *)local_1c0,(int)&list_value,(void *)0x0,0);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (list_val,(char *)local_1c0[0]);
  local_1d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar4 == 0);
  local_1d8.m_message.px = (element_type *)0x0;
  local_1d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_1e0 = "";
  local_1f0 = &stack0xfffffffffffffdc0;
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013894d8;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01388fc8;
  local_68._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_1f8 = list_val;
  local_68._8_8_ = &local_1f8;
  local_48._8_8_ = &local_1f0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1d8,(lazy_ostream *)&stack0xfffffffffffffdc8,1,2,REQUIRE,0xee8660,
             (size_t)&local_1e8,0x77,local_58,"list_val",local_78);
  boost::detail::shared_count::~shared_count(&local_1d8.m_message.pn);
  if (local_1c0[0] != local_1b0) {
    operator_delete(local_1c0[0],local_1b0[0] + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&list_value.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&list_value.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)list_value.val._M_dataplus._M_p != &list_value.val.field_2) {
    operator_delete(list_value.val._M_dataplus._M_p,
                    CONCAT71(list_value.val.field_2._M_allocated_capacity._1_7_,
                             list_value.val.field_2._M_local_buf[0]) + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&single_value.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&single_value.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)single_value.val._M_dataplus._M_p != &single_value.val.field_2) {
    operator_delete(single_value.val._M_dataplus._M_p,
                    single_value.val.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void CheckValues(const common::Settings& settings, const std::string& single_val, const std::string& list_val)
{
    common::SettingsValue single_value = GetSetting(settings, "section", "name", false, false, false);
    common::SettingsValue list_value(common::SettingsValue::VARR);
    for (const auto& item : GetSettingsList(settings, "section", "name", false)) {
        list_value.push_back(item);
    }
    BOOST_CHECK_EQUAL(single_value.write().c_str(), single_val);
    BOOST_CHECK_EQUAL(list_value.write().c_str(), list_val);
}